

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O3

void llvm::
     format_provider<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::format(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *V,
             raw_ostream *Stream,StringRef Style)

{
  bool bVar1;
  unsigned_long_long *in_R8;
  StringRef Str;
  StringRef Str_00;
  ulong local_20;
  unsigned_long_long ULLVal;
  
  if ((char *)Style.Length == (char *)0x0) {
    local_20 = 0xffffffffffffffff;
  }
  else {
    Str.Length = 10;
    Str.Data = (char *)Style.Length;
    bVar1 = getAsUnsignedInteger((llvm *)Style.Data,Str,(uint)&local_20,in_R8);
    if (bVar1) {
      __assert_fail("false && \"Style is not a valid integer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0xcd,
                    "static void llvm::format_provider<std::basic_string<char>>::format(const T &, llvm::raw_ostream &, StringRef) [T = std::basic_string<char>, Enable = void]"
                   );
    }
  }
  if (V->_M_string_length < local_20) {
    local_20 = V->_M_string_length;
  }
  Str_00.Length = local_20;
  Str_00.Data = (V->_M_dataplus)._M_p;
  raw_ostream::operator<<(Stream,Str_00);
  return;
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    size_t N = StringRef::npos;
    if (!Style.empty() && Style.getAsInteger(10, N)) {
      assert(false && "Style is not a valid integer");
    }
    llvm::StringRef S = V;
    Stream << S.substr(0, N);
  }